

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O2

int __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::
computeKeyRoots(APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                *this,TreeIndexAPTED *t2,int subtreeRootNode,int pathID,
               vector<int,_std::allocator<int>_> *keyRoots,int index)

{
  int subtreeRootNode_00;
  pointer pvVar1;
  int *piVar2;
  int index_00;
  int *piVar3;
  int iVar4;
  
  (keyRoots->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [index] = subtreeRootNode;
  index_00 = index + 1;
  while (iVar4 = pathID, subtreeRootNode < iVar4) {
    pvVar1 = (t2->super_PreLToChildren).prel_to_children_.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pathID = (t2->super_PreLToParent).prel_to_parent_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar4];
    piVar2 = *(pointer *)
              ((long)&pvVar1[pathID].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
    for (piVar3 = *(int **)&pvVar1[pathID].super__Vector_base<int,_std::allocator<int>_>._M_impl;
        piVar3 != piVar2; piVar3 = piVar3 + 1) {
      subtreeRootNode_00 = *piVar3;
      if (subtreeRootNode_00 != iVar4) {
        index_00 = computeKeyRoots(this,t2,subtreeRootNode_00,
                                   (t2->super_PreLToLLD).prel_to_lld_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[subtreeRootNode_00],keyRoots,
                                   index_00);
      }
    }
  }
  return index_00;
}

Assistant:

int APTEDTreeIndex<CostModel, TreeIndex>::computeKeyRoots(const TreeIndex& t2,
    int subtreeRootNode, int pathID, std::vector<int>& keyRoots, int index) {
  // The subtreeRootNode is a keyroot node. Add it to keyRoots.
  keyRoots[index] = subtreeRootNode;
  // Increment the index to know where to store the next keyroot node.
  ++index;
  // Walk up the left path starting with the leftmost leaf of subtreeRootNode,
  // until the child of subtreeRootNode.
  int pathNode = pathID;
  while (pathNode > subtreeRootNode) {
    int parent = t2.prel_to_parent_[pathNode];
    // For each sibling to the right of pathNode, execute this method recursively.
    // Each right sibling of pathNode is a keyroot node.
    for (int child : t2.prel_to_children_[parent]) {
      // Execute computeKeyRoots recursively for the new subtree rooted at child and child's leftmost leaf node.
      if (child != pathNode) index = computeKeyRoots(t2, child, t2.prel_to_lld_[child], keyRoots, index);
    }
    // Walk up.
    pathNode = parent;
  }
  return index;
}